

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePrinter.cpp
# Opt level: O0

void __thiscall
slang::ast::TypePrinter::visit(TypePrinter *this,PackedUnionType *type,string_view overrideName)

{
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string_view str_04;
  format_string<const_int_&> fmt;
  bool bVar1;
  pointer pFVar2;
  Symbol *in_RSI;
  size_t in_RDI;
  char *in_stack_ffffffffffffff58;
  FormatBuffer *in_stack_ffffffffffffff60;
  char *in_stack_ffffffffffffff70;
  int *in_stack_ffffffffffffff80;
  FormatBuffer *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  Scope *in_stack_ffffffffffffff98;
  TypePrinter *in_stack_ffffffffffffffa0;
  Scope *in_stack_ffffffffffffffc8;
  TypePrinter *in_stack_ffffffffffffffd0;
  basic_string_view<char,_std::char_traits<char>_> local_10;
  
  if (*(int *)(in_RDI + 8) == 1) {
    Symbol::getParentScope(in_RSI);
    printScope(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
    if (bVar1) {
      pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
               operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                           *)0xa6e2b9);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)pFVar2,
                 in_stack_ffffffffffffff58);
      str._M_str = in_stack_ffffffffffffff70;
      str._M_len = in_RDI;
      FormatBuffer::append(pFVar2,str);
    }
    else {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0xa6e2fc);
      str_00._M_str = in_stack_ffffffffffffff70;
      str_00._M_len = in_RDI;
      FormatBuffer::append(in_stack_ffffffffffffff60,str_00);
    }
  }
  else {
    pFVar2 = std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::
             operator->((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>
                         *)0xa6e341);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
               (char *)pFVar2);
    str_01._M_str = in_stack_ffffffffffffff70;
    str_01._M_len = in_RDI;
    FormatBuffer::append(in_stack_ffffffffffffff60,str_01);
    if ((in_RSI[1].name._M_len & 0x100000000) != 0) {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0xa6e387);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
                 (char *)pFVar2);
      str_02._M_str = in_stack_ffffffffffffff70;
      str_02._M_len = in_RDI;
      FormatBuffer::append(in_stack_ffffffffffffff60,str_02);
    }
    if ((in_RSI[2].name._M_len & 0x100000000) != 0) {
      std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                 0xa6e3d0);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff60,
                 (char *)pFVar2);
      str_03._M_str = in_stack_ffffffffffffff70;
      str_03._M_len = in_RDI;
      FormatBuffer::append(in_stack_ffffffffffffff60,str_03);
    }
    appendMembers(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if ((*(byte *)(in_RDI + 3) & 1) == 0) {
      bVar1 = std::basic_string_view<char,_std::char_traits<char>_>::empty(&local_10);
      if (bVar1) {
        Symbol::getParentScope(in_RSI);
        printScope(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0xa6e493);
        fmt.str.size_ = (size_t)in_stack_ffffffffffffff98;
        fmt.str.data_ = in_stack_ffffffffffffff90;
        FormatBuffer::format<int_const&>(in_stack_ffffffffffffff88,fmt,in_stack_ffffffffffffff80);
      }
      else {
        std::unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_>::operator->
                  ((unique_ptr<slang::FormatBuffer,_std::default_delete<slang::FormatBuffer>_> *)
                   0xa6e43d);
        str_04._M_str = in_stack_ffffffffffffff70;
        str_04._M_len = in_RDI;
        FormatBuffer::append(in_stack_ffffffffffffff60,str_04);
      }
    }
  }
  return;
}

Assistant:

void TypePrinter::visit(const PackedUnionType& type, std::string_view overrideName) {
    if (options.anonymousTypeStyle == TypePrintingOptions::FriendlyName) {
        printScope(type.getParentScope());

        if (overrideName.empty())
            buffer->append("<unnamed packed union>");
        else
            buffer->append(overrideName);
    }
    else {
        buffer->append("union packed");
        if (type.isSigned)
            buffer->append(" signed");

        if (type.isTagged)
            buffer->append(" tagged");

        appendMembers(type);

        if (options.skipScopedTypeNames)
            ;
        else if (!overrideName.empty())
            buffer->append(overrideName);
        else {
            printScope(type.getParentScope());
            buffer->format("u${}", type.systemId);
        }
    }
}